

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O1

uint32_t duckdb::StringStats::MaxStringLength(BaseStatistics *stats)

{
  InternalException *this;
  string local_40;
  
  if (((stats->type).id_ != SQLNULL) &&
     (((stats->stats_union).string_data.has_max_string_length & 1U) != 0)) {
    return (stats->stats_union).string_data.max_string_length;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "MaxStringLength called on statistics that does not have a max string length","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool StringStats::HasMaxStringLength(const BaseStatistics &stats) {
	if (stats.GetType().id() == LogicalTypeId::SQLNULL) {
		return false;
	}
	return StringStats::GetDataUnsafe(stats).has_max_string_length;
}